

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frm_driver.c
# Opt level: O0

FIELD * Next_Field_On_Page(FIELD *field)

{
  formnode *pfVar1;
  FIELD **local_38;
  FIELD **last_on_page;
  FIELD **first_on_page;
  FIELD **field_on_page;
  FORM *form;
  FIELD *field_local;
  
  pfVar1 = field->form;
  first_on_page = pfVar1->field + field->index;
  do {
    local_38 = pfVar1->field + pfVar1->page[pfVar1->curpage].pmin;
    if (first_on_page != pfVar1->field + pfVar1->page[pfVar1->curpage].pmax) {
      local_38 = first_on_page + 1;
    }
    first_on_page = local_38;
  } while ((((*local_38)->opts & 3U) != 3) && (field != *local_38));
  return *local_38;
}

Assistant:

INLINE static FIELD *Next_Field_On_Page(FIELD * field)
{
  FORM  *form = field->form;
  FIELD **field_on_page = &form->field[field->index];
  FIELD **first_on_page = &form->field[form->page[form->curpage].pmin];
  FIELD **last_on_page  = &form->field[form->page[form->curpage].pmax];

  do
    {
      field_on_page = 
        (field_on_page==last_on_page) ? first_on_page : field_on_page + 1;
      if (Field_Is_Selectable(*field_on_page))
        break;
    } while(field!=(*field_on_page));  
  return(*field_on_page);
}